

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  bool bVar1;
  pointer pbVar2;
  allocator local_59;
  string fullName;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar1) {
    std::__cxx11::string::assign((char *)fileName);
    bVar1 = cmsys::SystemTools::FileExists((fileName->_M_dataplus)._M_p,true);
    return bVar1;
  }
  std::__cxx11::string::string((string *)&fullName,dir,&local_59);
  std::__cxx11::string::append((char *)&fullName);
  std::__cxx11::string::append((char *)&fullName);
  bVar1 = cmsys::SystemTools::FileExists(fullName._M_dataplus._M_p,true);
  if (bVar1) {
    bVar1 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar2 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar2 == (this->IncludePath).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        bVar1 = false;
        goto LAB_004674b1;
      }
      std::__cxx11::string::_M_assign((string *)&fullName);
      std::__cxx11::string::append((char *)&fullName);
      std::__cxx11::string::append((char *)&fullName);
      bVar1 = cmsys::SystemTools::FileExists(fullName._M_dataplus._M_p,true);
      pbVar2 = pbVar2 + 1;
    } while (!bVar1);
    bVar1 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
LAB_004674b1:
  std::__cxx11::string::~string((string *)&fullName);
  return bVar1;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if(cmSystemTools::FileIsFullPath(includeName))
    {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName.c_str(), true);
    }
  else
    {
    // Check for the file in the directory containing the including
    // file.
    std::string fullName = dir;
    fullName += "/";
    fullName += includeName;
    if(cmSystemTools::FileExists(fullName.c_str(), true))
      {
      fileName = fullName;
      return true;
      }

    // Search the include path for the file.
    for(std::vector<std::string>::const_iterator i =
          this->IncludePath.begin(); i != this->IncludePath.end(); ++i)
      {
      fullName = *i;
      fullName += "/";
      fullName += includeName;
      if(cmSystemTools::FileExists(fullName.c_str(), true))
        {
        fileName = fullName;
        return true;
        }
      }
    }
  return false;
}